

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

S2Point * __thiscall S2Polygon::GetCentroid(S2Point *__return_storage_ptr__,S2Polygon *this)

{
  uint uVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  double dVar2;
  pointer puVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  VType VVar7;
  S2Point local_40;
  
  dVar5 = 0.0;
  dVar6 = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  puVar3 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3) < 1) {
    VVar7 = 0.0;
  }
  else {
    VVar7 = 0.0;
    lVar4 = 0;
    do {
      this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           puVar3[lVar4]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      uVar1 = *(int *)((long)this_00._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8);
      S2Loop::GetCentroid(&local_40,
                          (S2Loop *)
                          this_00._M_t.
                          super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl);
      dVar2 = (double)(int)(-(uVar1 & 1) | 1);
      VVar7 = VVar7 + local_40.c_[0] * dVar2;
      dVar5 = dVar5 + dVar2 * local_40.c_[1];
      dVar6 = dVar6 + dVar2 * local_40.c_[2];
      lVar4 = lVar4 + 1;
      puVar3 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->loops_).
                                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                          >> 3));
    __return_storage_ptr__->c_[1] = dVar5;
    __return_storage_ptr__->c_[2] = dVar6;
  }
  __return_storage_ptr__->c_[0] = VVar7;
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polygon::GetCentroid() const {
  S2Point centroid;
  for (int i = 0; i < num_loops(); ++i) {
    centroid += loop(i)->sign() * loop(i)->GetCentroid();
  }
  return centroid;
}